

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O0

void __thiscall QSqlCachedResult::cleanup(QSqlCachedResult *this,EVP_PKEY_CTX *ctx)

{
  QSqlCachedResultPrivate *this_00;
  EVP_PKEY_CTX *ctx_00;
  QSqlCachedResultPrivate *d;
  
  this_00 = d_func((QSqlCachedResult *)0x119bfb);
  (*(this->super_QSqlResult)._vptr_QSqlResult[3])();
  ctx_00 = (EVP_PKEY_CTX *)0x0;
  (*(this->super_QSqlResult)._vptr_QSqlResult[4])();
  QSqlCachedResultPrivate::cleanup(this_00,ctx_00);
  return;
}

Assistant:

void QSqlCachedResult::cleanup()
{
    Q_D(QSqlCachedResult);
    setAt(QSql::BeforeFirstRow);
    setActive(false);
    d->cleanup();
}